

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

String * __thiscall
capnp::JsonCodec::Impl::encodeString(String *__return_storage_ptr__,Impl *this,StringPtr chars)

{
  String *pSVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  char c;
  Vector<char> escaped;
  byte local_81;
  StringPtr local_80;
  String *local_70;
  ArrayBuilder<char> local_68;
  Array<char> local_48;
  
  sVar2 = chars.content.size_;
  local_70 = __return_storage_ptr__;
  local_68.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<char>(sVar2 + 2);
  local_68.endPtr = local_68.ptr + sVar2 + 2;
  local_68.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_80.content.ptr = (char *)CONCAT71(local_80.content.ptr._1_7_,0x22);
  local_68.pos = local_68.ptr;
  kj::Vector<char>::add<char>((Vector<char> *)&local_68,(char *)&local_80);
  lVar3 = 0;
  do {
    if (sVar2 - 1 == lVar3) {
      local_80.content.ptr._0_1_ = 0x22;
      kj::Vector<char>::add<char>((Vector<char> *)&local_68,(char *)&local_80);
      local_80.content.ptr = (char *)((ulong)local_80.content.ptr._1_7_ << 8);
      kj::Vector<char>::add<char>((Vector<char> *)&local_68,(char *)&local_80);
      kj::Vector<char>::releaseAsArray(&local_48,(Vector<char> *)&local_68);
      pSVar1 = local_70;
      (local_70->content).ptr = local_48.ptr;
      (local_70->content).size_ = local_48.size_;
      (local_70->content).disposer = local_48.disposer;
      local_48.ptr = (char *)0x0;
      local_48.size_ = 0;
      kj::Array<char>::~Array(&local_48);
      kj::ArrayBuilder<char>::dispose(&local_68);
      return pSVar1;
    }
    local_81 = chars.content.ptr[lVar3];
    switch(local_81) {
    case 8:
      local_80.content.ptr = "\\b";
      local_80.content.size_ = 3;
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case 9:
      local_80.content.ptr = "\\t";
      local_80.content.size_ = 3;
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case 10:
      local_80.content.ptr = "\\n";
      local_80.content.size_ = 3;
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case 0xb:
switchD_003d94fe_caseD_b:
      if (local_81 < 0x20) {
        local_80.content.ptr = "\\u00";
        local_80.content.size_ = 5;
        kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
        uVar4 = (uint)local_81;
        kj::Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789abcdef" + (local_81 >> 4));
        kj::Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789abcdef" + (uVar4 & 0xf));
      }
      else {
        kj::Vector<char>::add<char&>((Vector<char> *)&local_68,(char *)&local_81);
      }
      break;
    case 0xc:
      local_80.content.ptr = "\\f";
      local_80.content.size_ = 3;
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    case 0xd:
      local_80.content.ptr = "\\r";
      local_80.content.size_ = 3;
      kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      break;
    default:
      if (local_81 == 0x5c) {
        local_80.content.ptr = "\\\\";
        local_80.content.size_ = 3;
        kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      }
      else {
        if (local_81 != 0x22) goto switchD_003d94fe_caseD_b;
        local_80.content.ptr = "\\\"";
        local_80.content.size_ = 3;
        kj::Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_80);
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

kj::String encodeString(kj::StringPtr chars) const {
    static const char HEXDIGITS[] = "0123456789abcdef";
    kj::Vector<char> escaped(chars.size() + 3);

    escaped.add('"');
    for (char c: chars) {
      switch (c) {
        case '\"': escaped.addAll(kj::StringPtr("\\\"")); break;
        case '\\': escaped.addAll(kj::StringPtr("\\\\")); break;
        case '\b': escaped.addAll(kj::StringPtr("\\b")); break;
        case '\f': escaped.addAll(kj::StringPtr("\\f")); break;
        case '\n': escaped.addAll(kj::StringPtr("\\n")); break;
        case '\r': escaped.addAll(kj::StringPtr("\\r")); break;
        case '\t': escaped.addAll(kj::StringPtr("\\t")); break;
        default:
          if (static_cast<uint8_t>(c) < 0x20) {
            escaped.addAll(kj::StringPtr("\\u00"));
            uint8_t c2 = c;
            escaped.add(HEXDIGITS[c2 / 16]);
            escaped.add(HEXDIGITS[c2 % 16]);
          } else {
            escaped.add(c);
          }
          break;
      }
    }
    escaped.add('"');
    escaped.add('\0');

    return kj::String(escaped.releaseAsArray());
  }